

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

char * jsonnet_fmt_snippet(JsonnetVm *vm,char *filename,char *snippet,int *error)

{
  char *pcVar1;
  
  pcVar1 = jsonnet_fmt_snippet_aux(vm,filename,snippet,error);
  return pcVar1;
}

Assistant:

char *jsonnet_fmt_snippet(JsonnetVm *vm, const char *filename, const char *snippet, int *error)
{
    TRY
        return jsonnet_fmt_snippet_aux(vm, filename, snippet, error);
    CATCH("jsonnet_fmt_snippet")
    return nullptr;  // Never happens.
}